

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O1

void __thiscall
QEvdevTouchScreenData::QEvdevTouchScreenData
          (QEvdevTouchScreenData *this,QEvdevTouchScreenHandler *q_ptr,QStringList *args)

{
  undefined1 *puVar1;
  char16_t *pcVar2;
  bool bVar3;
  char cVar4;
  CutResult CVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  qreal *pqVar9;
  char16_t *pcVar10;
  QTransform *pQVar11;
  qsizetype qVar12;
  QString *arg;
  QString *s1;
  long in_FS_OFFSET;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->q = q_ptr;
  this->m_lastEventType = -1;
  (this->m_touchPoints).d.d = (Data *)0x0;
  (this->m_touchPoints).d.ptr = (TouchPoint *)0x0;
  (this->m_touchPoints).d.size = 0;
  (this->m_lastTouchPoints).d.d = (Data *)0x0;
  (this->m_lastTouchPoints).d.ptr = (TouchPoint *)0x0;
  (this->m_lastTouchPoints).d.size = 0;
  (this->m_contacts).d = (Data *)0x0;
  (this->m_lastContacts).d = (Data *)0x0;
  (this->m_currentData).trackingId = -1;
  (this->m_currentData).x = 0;
  (this->m_currentData).y = 0;
  (this->m_currentData).maj = -1;
  (this->m_currentData).pressure = 0;
  (this->m_currentData).state = Pressed;
  this->m_currentSlot = 0;
  this->m_timeStamp = 0.0;
  this->m_lastTimeStamp = 0.0;
  this->hw_range_x_min = 0;
  this->hw_range_x_max = 0;
  this->hw_range_y_min = 0;
  this->hw_range_y_max = 0;
  this->hw_pressure_min = 0;
  this->hw_pressure_max = 0;
  (this->hw_name).d.d = (Data *)0x0;
  (this->hw_name).d.ptr = (char16_t *)0x0;
  (this->hw_name).d.size = 0;
  (this->deviceNode).d.d = (Data *)0x0;
  (this->deviceNode).d.ptr = (char16_t *)0x0;
  *(undefined8 *)((long)&(this->deviceNode).d.ptr + 2) = 0;
  *(undefined8 *)((long)&(this->deviceNode).d.size + 2) = 0;
  pqVar9 = (qreal *)&DAT_00116ad0;
  pQVar11 = &this->m_rotate;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    pQVar11->m_matrix[0][0] = *pqVar9;
    pqVar9 = pqVar9 + 1;
    pQVar11 = (QTransform *)(pQVar11->m_matrix[0] + 1);
  }
  puVar1 = &(this->m_rotate).field_0x48;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
  this->m_singleTouch = false;
  this->m_prediction = 0;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->m_screenName).d.d = (Data *)0x0;
  (this->m_screenName).d.ptr = (char16_t *)0x0;
  (this->m_screenName).d.size = 0;
  (this->m_screen).wp.d = (Data *)0x0;
  *(undefined8 *)((long)&(this->m_screen).wp.d + 1) = 0;
  *(undefined8 *)((long)&(this->m_screen).wp.value + 1) = 0;
  lVar8 = (args->d).size;
  if (lVar8 != 0) {
    s1 = (args->d).ptr;
    lVar8 = lVar8 * 0x18;
    do {
      bVar3 = comparesEqual(s1,L"force_window");
      if (bVar3) {
        this->m_forceToActiveWindow = true;
      }
      else {
        bVar3 = comparesEqual(s1,L"filtered");
        if (bVar3) {
          this->m_filtered = true;
        }
        else {
          pcVar2 = (s1->d).ptr;
          qVar12 = (s1->d).size;
          QVar13.m_data = pcVar2;
          QVar13.m_size = qVar12;
          QVar15.m_data = L"prediction=";
          QVar15.m_size = 0xb;
          cVar4 = QtPrivate::startsWith(QVar13,QVar15,CaseSensitive);
          if (cVar4 != '\0') {
            local_40 = 0xb;
            local_48 = -1;
            CVar5 = QtPrivate::QContainerImplHelper::mid(qVar12,&local_40,&local_48);
            pcVar10 = (char16_t *)0x0;
            qVar12 = 0;
            if (CVar5 != Null) {
              pcVar10 = pcVar2 + local_40;
              qVar12 = local_48;
            }
            QVar14.m_data = pcVar10;
            QVar14.m_size = qVar12;
            lVar7 = QString::toIntegral_helper(QVar14,(bool *)0x0,10);
            iVar6 = (int)lVar7;
            if (iVar6 != lVar7) {
              iVar6 = 0;
            }
            this->m_prediction = iVar6;
          }
        }
      }
      s1 = s1 + 1;
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEvdevTouchScreenData::QEvdevTouchScreenData(QEvdevTouchScreenHandler *q_ptr, const QStringList &args)
    : q(q_ptr),
      m_lastEventType(-1),
      m_currentSlot(0),
      m_timeStamp(0), m_lastTimeStamp(0),
      hw_range_x_min(0), hw_range_x_max(0),
      hw_range_y_min(0), hw_range_y_max(0),
      hw_pressure_min(0), hw_pressure_max(0),
      m_forceToActiveWindow(false), m_typeB(false), m_singleTouch(false),
      m_filtered(false), m_prediction(0)
{
    for (const QString &arg : args) {
        if (arg == u"force_window")
            m_forceToActiveWindow = true;
        else if (arg == u"filtered")
            m_filtered = true;
        else if (const QStringView prefix = u"prediction="; arg.startsWith(prefix))
            m_prediction = QStringView(arg).mid(prefix.size()).toInt();
    }
}